

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0405(ParserTester *this)

{
  ParseOptions parseOpts;
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  ParseOptions local_218;
  allocator<psy::C::SyntaxKind> local_1f1;
  SyntaxKind local_1f0 [8];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"struct { x y ; } z;",&local_31);
  Expectation::Expectation(&local_1b8);
  local_1f0[0] = STARTof_Node;
  local_1f0[1] = 0x3ee;
  local_1f0[2] = 0x408;
  local_1f0[3] = 0x403;
  local_1f0[4] = 0x3ef;
  local_1f0[5] = 0x407;
  local_1f0[6] = 0x412;
  local_1f0[7] = 0x412;
  local_1e0 = local_1f0;
  local_1d8 = 8;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1f1);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_1f1);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_218);
  parseOpts.langExts_.translations_.field_0 = local_218.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_218.langDialect_.std_;
  parseOpts._1_7_ = local_218._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_218.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_218.field_2;
  parseOpts._26_6_ = local_218._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1f1);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0405()
{
    parse("struct { x y ; } z;",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::VariableAndOrFunctionDeclaration,
                              SyntaxKind::TagDeclarationAsSpecifier,
                              SyntaxKind::StructTypeSpecifier,
                              SyntaxKind::FieldDeclaration,
                              SyntaxKind::TypedefName,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::IdentifierDeclarator }));
}